

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

mpc_parser_t * mpc_define(mpc_parser_t *p,mpc_parser_t *a)

{
  void *pvVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  mpc_parser_t *__ptr;
  
  if (p->retained == '\0') {
    __ptr = mpc_failf("Attempt to assign to Unretained Parser!");
    p->type = __ptr->type;
    (p->data).check_with.e = (__ptr->data).check_with.e;
    pcVar3 = (__ptr->data).fail.m;
    pvVar1 = (__ptr->data).lift.x;
    pcVar4 = (__ptr->data).check.e;
    (p->data).apply_to.d = (__ptr->data).apply_to.d;
    (p->data).check.e = pcVar4;
    (p->data).fail.m = pcVar3;
    (p->data).lift.x = pvVar1;
    free(__ptr);
  }
  else {
    p->type = a->type;
    pvVar1 = (a->data).lift.x;
    pvVar2 = (a->data).apply_to.d;
    pcVar3 = (a->data).check.e;
    (p->data).fail.m = (a->data).fail.m;
    (p->data).lift.x = pvVar1;
    (p->data).apply_to.d = pvVar2;
    (p->data).check.e = pcVar3;
    (p->data).check_with.e = (a->data).check_with.e;
  }
  free(a);
  return p;
}

Assistant:

mpc_parser_t *mpc_define(mpc_parser_t *p, mpc_parser_t *a) {

  if (p->retained) {
    p->type = a->type;
    p->data = a->data;
  } else {
    mpc_parser_t *a2 = mpc_failf("Attempt to assign to Unretained Parser!");
    p->type = a2->type;
    p->data = a2->data;
    free(a2);
  }

  free(a);
  return p;
}